

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O3

char * uprv_tzname_63(int n)

{
  int iVar1;
  UBool UVar2;
  char cVar3;
  int iVar4;
  char *pcVar5;
  ssize_t sVar6;
  char *pcVar7;
  DefaultTZInfo *tzInfo;
  uint uVar8;
  long lVar9;
  tm decemberSol;
  tm juneSol;
  char *local_a8;
  tm local_a0;
  tm local_68;
  
  pcVar5 = getenv("TZ");
  local_a8 = pcVar5;
  if ((pcVar5 != (char *)0x0) && (UVar2 = isValidOlsonID(pcVar5), UVar2 != '\0')) {
    if (*pcVar5 == ':') {
      local_a8 = pcVar5 + 1;
    }
    skipZoneIDPrefix(&local_a8);
    return local_a8;
  }
  if (gTimeZoneBufferPtr != (char *)0x0) {
    return gTimeZoneBufferPtr;
  }
  sVar6 = readlink("/etc/localtime",gTimeZoneBuffer,0xfff);
  if ((int)(uint)sVar6 < 1) {
    tzInfo = (DefaultTZInfo *)uprv_malloc_63(0x20);
    if (tzInfo != (DefaultTZInfo *)0x0) {
      tzInfo->defaultTZPosition = 0;
      tzInfo->defaultTZBuffer = (char *)0x0;
      tzInfo->defaultTZFileSize = 0;
      *(undefined8 *)((long)&tzInfo->defaultTZFileSize + 1) = 0;
      *(undefined8 *)((long)&tzInfo->defaultTZFilePtr + 1) = 0;
      gTimeZoneBufferPtr = searchForTZFile("/usr/share/zoneinfo/",tzInfo);
      if (tzInfo->defaultTZBuffer != (char *)0x0) {
        uprv_free_63(tzInfo->defaultTZBuffer);
      }
      if ((FILE *)tzInfo->defaultTZFilePtr != (FILE *)0x0) {
        fclose((FILE *)tzInfo->defaultTZFilePtr);
      }
      uprv_free_63(tzInfo);
    }
    pcVar5 = gTimeZoneBufferPtr;
    if (gTimeZoneBufferPtr == (char *)0x0) goto LAB_00292b96;
    cVar3 = isValidOlsonID(gTimeZoneBufferPtr);
    pcVar7 = gTimeZoneBufferPtr;
  }
  else {
    gTimeZoneBuffer[(uint)sVar6 & 0x7fffffff] = '\0';
    pcVar7 = strstr(gTimeZoneBuffer,"/zoneinfo/");
    if (pcVar7 == (char *)0x0) goto LAB_00292b96;
    pcVar7 = pcVar7 + 10;
    cVar3 = isValidOlsonID(pcVar7);
    pcVar5 = pcVar7;
  }
  if (cVar3 != '\0') {
    gTimeZoneBufferPtr = pcVar7;
    return pcVar5;
  }
LAB_00292b96:
  localtime_r(&uprv_tzname_63::juneSolstice,&local_68);
  localtime_r(&uprv_tzname_63::decemberSolstice,&local_a0);
  pcVar7 = _strcmp;
  pcVar5 = _tzname;
  iVar1 = ___timezone;
  uVar8 = 2;
  if (local_a0.tm_isdst < 1) {
    uVar8 = (uint)(0 < local_68.tm_isdst);
  }
  lVar9 = 0x18;
  while ((((*(int *)((long)&icu_63::ParsePosition::typeinfo + lVar9) != iVar1 ||
           (*(uint *)((long)&icu_63::ParsePosition::typeinfo + lVar9 + 4) != uVar8)) ||
          (iVar4 = strcmp(*(char **)((long)&PTR_typeinfo_name_003ab3c0 + lVar9),pcVar5), iVar4 != 0)
          ) || (iVar4 = strcmp(*(char **)((long)&PTR_typeinfo_003ab3c8 + lVar9),pcVar7), iVar4 != 0)
         )) {
    lVar9 = lVar9 + 0x20;
    if (lVar9 == 0x778) {
LAB_00292c3f:
      return *(char **)(&tzname + (long)n * 8);
    }
  }
  pcVar5 = *(char **)((long)&OFFSET_ZONE_MAPPINGS[0].offsetSeconds + lVar9);
  if (pcVar5 != (char *)0x0) {
    return pcVar5;
  }
  goto LAB_00292c3f;
}

Assistant:

U_CAPI const char* U_EXPORT2
uprv_tzname(int n)
{
    (void)n; // Avoid unreferenced parameter warning.
    const char *tzid = NULL;
#if U_PLATFORM_USES_ONLY_WIN32_API
    tzid = uprv_detectWindowsTimeZone();

    if (tzid != NULL) {
        return tzid;
    }

#ifndef U_TZNAME
    // The return value is free'd in timezone.cpp on Windows because
    // the other code path returns a pointer to a heap location.
    // If we don't have a name already, then tzname wouldn't be any
    // better, so just fall back.
    return uprv_strdup("Etc/UTC");
#endif // !U_TZNAME

#else

/*#if U_PLATFORM_IS_DARWIN_BASED
    int ret;

    tzid = getenv("TZFILE");
    if (tzid != NULL) {
        return tzid;
    }
#endif*/

/* This code can be temporarily disabled to test tzname resolution later on. */
#ifndef DEBUG_TZNAME
    tzid = getenv("TZ");
    if (tzid != NULL && isValidOlsonID(tzid)
#if U_PLATFORM == U_PF_SOLARIS
    /* When TZ equals localtime on Solaris, check the /etc/localtime file. */
        && uprv_strcmp(tzid, TZ_ENV_CHECK) != 0
#endif
    ) {
        /* The colon forces tzset() to treat the remainder as zoneinfo path */ 
        if (tzid[0] == ':') { 
            tzid++; 
        } 
        /* This might be a good Olson ID. */
        skipZoneIDPrefix(&tzid);
        return tzid;
    }
    /* else U_TZNAME will give a better result. */
#endif

#if defined(CHECK_LOCALTIME_LINK) && !defined(DEBUG_SKIP_LOCALTIME_LINK)
    /* Caller must handle threading issues */
    if (gTimeZoneBufferPtr == NULL) {
        /*
        This is a trick to look at the name of the link to get the Olson ID
        because the tzfile contents is underspecified.
        This isn't guaranteed to work because it may not be a symlink.
        */
        int32_t ret = (int32_t)readlink(TZDEFAULT, gTimeZoneBuffer, sizeof(gTimeZoneBuffer)-1);
        if (0 < ret) {
            int32_t tzZoneInfoTailLen = uprv_strlen(TZZONEINFOTAIL);
            gTimeZoneBuffer[ret] = 0;
            char *  tzZoneInfoTailPtr = uprv_strstr(gTimeZoneBuffer, TZZONEINFOTAIL);
            
            if (tzZoneInfoTailPtr != NULL
                && isValidOlsonID(tzZoneInfoTailPtr + tzZoneInfoTailLen))
            {
                return (gTimeZoneBufferPtr = tzZoneInfoTailPtr + tzZoneInfoTailLen);
            }
        } else {
#if defined(SEARCH_TZFILE)
            DefaultTZInfo* tzInfo = (DefaultTZInfo*)uprv_malloc(sizeof(DefaultTZInfo));
            if (tzInfo != NULL) {
                tzInfo->defaultTZBuffer = NULL;
                tzInfo->defaultTZFileSize = 0;
                tzInfo->defaultTZFilePtr = NULL;
                tzInfo->defaultTZstatus = FALSE;
                tzInfo->defaultTZPosition = 0;

                gTimeZoneBufferPtr = searchForTZFile(TZZONEINFO, tzInfo);

                /* Free previously allocated memory */
                if (tzInfo->defaultTZBuffer != NULL) {
                    uprv_free(tzInfo->defaultTZBuffer);
                }
                if (tzInfo->defaultTZFilePtr != NULL) {
                    fclose(tzInfo->defaultTZFilePtr);
                }
                uprv_free(tzInfo);
            }

            if (gTimeZoneBufferPtr != NULL && isValidOlsonID(gTimeZoneBufferPtr)) {
                return gTimeZoneBufferPtr;
            }
#endif
        }
    }
    else {
        return gTimeZoneBufferPtr;
    }
#endif
#endif

#ifdef U_TZNAME
#if U_PLATFORM_USES_ONLY_WIN32_API
    /* The return value is free'd in timezone.cpp on Windows because
     * the other code path returns a pointer to a heap location. */
    return uprv_strdup(U_TZNAME[n]);
#else
    /*
    U_TZNAME is usually a non-unique abbreviation, which isn't normally usable.
    So we remap the abbreviation to an olson ID.

    Since Windows exposes a little more timezone information,
    we normally don't use this code on Windows because
    uprv_detectWindowsTimeZone should have already given the correct answer.
    */
    {
        struct tm juneSol, decemberSol;
        int daylightType;
        static const time_t juneSolstice=1182478260; /*2007-06-21 18:11 UT*/
        static const time_t decemberSolstice=1198332540; /*2007-12-22 06:09 UT*/

        /* This probing will tell us when daylight savings occurs.  */
        localtime_r(&juneSolstice, &juneSol);
        localtime_r(&decemberSolstice, &decemberSol);
        if(decemberSol.tm_isdst > 0) {
          daylightType = U_DAYLIGHT_DECEMBER;
        } else if(juneSol.tm_isdst > 0) {
          daylightType = U_DAYLIGHT_JUNE;
        } else {
          daylightType = U_DAYLIGHT_NONE;
        }
        tzid = remapShortTimeZone(U_TZNAME[0], U_TZNAME[1], daylightType, uprv_timezone());
        if (tzid != NULL) {
            return tzid;
        }
    }
    return U_TZNAME[n];
#endif
#else
    return "";
#endif
}